

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplaintextedit.cpp
# Opt level: O1

int __thiscall QPlainTextEdit::qt_metacall(QPlainTextEdit *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = QAbstractScrollArea::qt_metacall((QAbstractScrollArea *)this,_c,_id,_a);
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 < 0x1a) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
      _id_00 = _id_00 + -0x1a;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 0x1a) {
        *(undefined8 *)*_a = 0;
      }
      _id_00 = _id_00 + -0x1a;
    }
    if ((_c < CustomCall) && ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 + -0xf;
    }
  }
  return _id_00;
}

Assistant:

int QPlainTextEdit::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractScrollArea::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 26)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 26;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 26)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 26;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 15;
    }
    return _id;
}